

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O0

void __thiscall
Cleaner::Cleaner(Cleaner *this,State *state,BuildConfig *config,DiskInterface *disk_interface)

{
  DiskInterface *disk_interface_local;
  BuildConfig *config_local;
  State *state_local;
  Cleaner *this_local;
  
  this->state_ = state;
  this->config_ = config;
  DyndepLoader::DyndepLoader(&this->dyndep_loader_,state,disk_interface);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->removed_);
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::set(&this->cleaned_);
  this->cleaned_files_count_ = 0;
  this->disk_interface_ = disk_interface;
  this->status_ = 0;
  return;
}

Assistant:

Cleaner::Cleaner(State* state,
                 const BuildConfig& config,
                 DiskInterface* disk_interface)
  : state_(state),
    config_(config),
    dyndep_loader_(state, disk_interface),
    cleaned_files_count_(0),
    disk_interface_(disk_interface),
    status_(0) {
}